

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O1

char * BinaryCache::FindBytecode(char *moduleName,bool addExtension)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  char *unaff_RBX;
  undefined7 in_register_00000031;
  char cVar6;
  char path [1024];
  char local_438 [1032];
  
  if (((int)CONCAT71(in_register_00000031,addExtension) != 0) ||
     (uVar1 = NULLC::GetStringHash(moduleName), unaff_RBX = lastBytecode, uVar1 != lastHash)) {
    pcVar3 = strstr(moduleName,".nc");
    if (addExtension) {
      if (pcVar3 != (char *)0x0) {
        __assert_fail("strstr(moduleName, \".nc\") == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/BinaryCache.cpp"
                      ,0xb2,"const char *BinaryCache::FindBytecode(const char *, bool)");
      }
    }
    else if (pcVar3 == (char *)0x0) {
      __assert_fail("strstr(moduleName, \".nc\") != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/BinaryCache.cpp"
                    ,0xb4,"const char *BinaryCache::FindBytecode(const char *, bool)");
    }
    uVar1 = 0;
    do {
      if (uVar1 < DAT_0024bf74) {
        pcVar3 = *(char **)(importPaths + (ulong)uVar1 * 8);
      }
      else {
        pcVar3 = (char *)0x0;
      }
      if (pcVar3 == (char *)0x0) {
        cVar6 = '\x03';
      }
      else {
        iVar2 = NULLC::SafeSprintf(local_438,0x400,"%s%s",pcVar3,moduleName);
        if (addExtension) {
          sVar4 = strlen(pcVar3);
          pcVar3 = local_438 + sVar4;
          sVar4 = strlen(pcVar3);
          if ((int)sVar4 != 0) {
            uVar5 = 0;
            do {
              if (pcVar3[uVar5] == '.') {
                pcVar3[uVar5] = '/';
              }
              uVar5 = uVar5 + 1;
            } while ((sVar4 & 0xffffffff) != uVar5);
          }
          NULLC::SafeSprintf(local_438 + iVar2,(ulong)(0x400 - iVar2),".nc");
        }
        pcVar3 = GetBytecode(local_438);
        cVar6 = pcVar3 != (char *)0x0;
        if ((bool)cVar6) {
          unaff_RBX = pcVar3;
        }
      }
      uVar1 = uVar1 + 1;
    } while (cVar6 == '\0');
    if (cVar6 == '\x03') {
      unaff_RBX = (char *)0x0;
    }
  }
  return unaff_RBX;
}

Assistant:

const char*	BinaryCache::FindBytecode(const char* moduleName, bool addExtension)
{
	if(!addExtension)
	{
		unsigned int hash = NULLC::GetStringHash(moduleName);

		if(hash == lastHash)
			return lastBytecode;
	}

	if(addExtension)
		assert(strstr(moduleName, ".nc") == 0);
	else
		assert(strstr(moduleName, ".nc") != 0);

	const unsigned pathLength = 1024;
	char path[pathLength];

	unsigned modulePathPos = 0;
	while(const char *modulePath = BinaryCache::EnumImportPath(modulePathPos++))
	{
		char *pathEnd = path + NULLC::SafeSprintf(path, pathLength, "%s%s", modulePath, moduleName);

		if(addExtension)
		{
			char *pathNoImport = path + strlen(modulePath);

			for(unsigned i = 0, e = (unsigned)strlen(pathNoImport); i != e; i++)
			{
				if(pathNoImport[i] == '.')
					pathNoImport[i] = '/';
			}

			NULLC::SafeSprintf(pathEnd, pathLength - int(pathEnd - path), ".nc");
		}

		if(const char *bytecode = BinaryCache::GetBytecode(path))
			return bytecode;
	}

	return NULL;
}